

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_generator.hpp
# Opt level: O1

node_pointer __thiscall
ranger::bhvr_tree::
xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
::generate(xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
           *this,char *str,size_t len)

{
  node_type *node;
  xml_node<char> *data;
  long in_RCX;
  pointer *__ptr;
  vector<char,_std::allocator<char>_> buf;
  xml_document<char> doc;
  char *apcStack_100c0 [3];
  xml_document<char> xStack_100a8;
  
  std::vector<char,std::allocator<char>>::vector<char_const*,void>
            ((vector<char,std::allocator<char>> *)apcStack_100c0,(char *)len,
             (char *)(len + 1 + in_RCX),(allocator_type *)&xStack_100a8);
  xStack_100a8.super_xml_node<char>.super_xml_base<char>.m_parent = (xml_node<char> *)0x0;
  xStack_100a8.super_xml_node<char>.super_xml_base<char>.m_name = (char *)0x0;
  xStack_100a8.super_xml_node<char>.super_xml_base<char>.m_value = (char *)0x0;
  xStack_100a8.super_xml_node<char>.m_type = node_document;
  xStack_100a8.super_xml_node<char>.m_first_node = (xml_node<char> *)0x0;
  xStack_100a8.super_xml_node<char>.m_first_attribute = (xml_attribute<char> *)0x0;
  xStack_100a8.super_memory_pool<char>.m_end =
       (char *)&xStack_100a8.super_memory_pool<char>.m_alloc_func;
  xStack_100a8.super_memory_pool<char>.m_begin =
       xStack_100a8.super_memory_pool<char>.m_static_memory;
  xStack_100a8.super_memory_pool<char>.m_alloc_func = (alloc_func *)0x0;
  xStack_100a8.super_memory_pool<char>.m_free_func = (free_func *)0x0;
  xStack_100a8.super_memory_pool<char>.m_ptr = xStack_100a8.super_memory_pool<char>.m_begin;
  rapidxml::xml_document<char>::parse<0>(&xStack_100a8,apcStack_100c0[0]);
  data = rapidxml::xml_node<char>::first_node(&xStack_100a8.super_xml_node<char>,"bhvr_tree",0,true)
  ;
  if (data == (xml_node<char> *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"bhvr_tree_error: cannot find root node",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    (this->super_template_extend<true_node,_false_node>).super_generator_interface<_86869e04_>.
    super_generator_unit<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_rapidxml::xml_node<char>_*,_ranger::bhvr_tree::selector_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>
    ._vptr_generator_unit = (_func_int **)0x0;
  }
  else {
    generate_node_by_data(this,(xml_node<char> *)str);
    node = (node_type *)
           (this->super_template_extend<true_node,_false_node>).
           super_generator_interface<_86869e04_>.
           super_generator_unit<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_rapidxml::xml_node<char>_*,_ranger::bhvr_tree::selector_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>
           ._vptr_generator_unit;
    if (node != (node_type *)0x0) {
      generate_children((xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
                         *)str,data,node);
    }
  }
  rapidxml::memory_pool<char>::clear(&xStack_100a8.super_memory_pool<char>);
  if (apcStack_100c0[0] != (char *)0x0) {
    operator_delete(apcStack_100c0[0]);
  }
  return (__uniq_ptr_data<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>,_true,_true>
          )(__uniq_ptr_data<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>,_true,_true>
            )this;
}

Assistant:

node_pointer generate(const char* str, size_t len) const {
    try {
      std::vector<char> buf(str, str + len + 1);
      rapidxml::xml_document<> doc;
      doc.parse<0>(buf.data());

      auto data = doc.first_node("bhvr_tree");
      if (!data) {
        std::cerr << "bhvr_tree_error: cannot find root node" << std::endl;
        return node_pointer();
      }

      auto node = generate_node_by_data(data);
      if (node) {
        generate_children(data, *node);
      }

      return node;
    } catch (const rapidxml::parse_error& e) {
      std::cerr << "parse_error: " << e.what() << " [" << e.where<const char>() << "]" << std::endl;
    }

    return node_pointer();
  }